

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O3

int __thiscall QAccessibleMainWindow::childCount(QAccessibleMainWindow *this)

{
  int *piVar1;
  qsizetype qVar2;
  QWidget *widget;
  long in_FS_OFFSET;
  QWidgetList local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d._0_4_ = 0xaaaaaaaa;
  local_28.d.d._4_4_ = 0xaaaaaaaa;
  local_28.d.ptr._0_4_ = 0xaaaaaaaa;
  local_28.d.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  widget = (QWidget *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
  _q_ac_childWidgets(&local_28,widget);
  qVar2 = local_28.d.size;
  piVar1 = (int *)CONCAT44(local_28.d.d._4_4_,local_28.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_28.d.d._4_4_,local_28.d.d._0_4_),8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (int)qVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMainWindow::childCount() const
{
    QList<QWidget*> kids = _q_ac_childWidgets(mainWindow());
    return kids.size();
}